

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

int ABC_Check_Integrity(ABC_Manager mng)

{
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *p;
  void *pvVar1;
  int iVar2;
  
  pNtk = mng->pNtk;
  for (iVar2 = 0; p = pNtk->vObjs, iVar2 < p->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p,iVar2);
    if ((((pvVar1 != (void *)0x0) && (iVar2 != 0)) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7))
       && (*(int *)((long)pvVar1 + 0x2c) == 0)) goto LAB_0043b85f;
  }
  iVar2 = Abc_NtkDoCheck(pNtk);
  if (iVar2 == 0) {
    puts("ABC_Check_Integrity: The internal network check has failed.");
LAB_0043b85f:
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int ABC_Check_Integrity( ABC_Manager mng )
{
    Abc_Ntk_t * pNtk = mng->pNtk;
    Abc_Obj_t * pObj;
    int i;

    // check that there are no dangling nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) 
            continue;
        if ( Abc_ObjFanoutNum(pObj) == 0 )
        {
//            printf( "ABC_Check_Integrity: The network has dangling nodes.\n" );
            return 0;
        }
    }

    // make sure everything is okay with the network structure
    if ( !Abc_NtkDoCheck( pNtk ) )
    {
        printf( "ABC_Check_Integrity: The internal network check has failed.\n" );
        return 0;
    }
    return 1;
}